

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

int pulse_stream_get_position(cubeb_stream_conflict *stm,uint64_t *position)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  pa_usec_t r_usec;
  
  iVar5 = -1;
  if ((stm != (cubeb_stream_conflict *)0x0) && (stm->output_stream != (pa_stream *)0x0)) {
    iVar1 = (*cubeb_pa_threaded_mainloop_in_thread)(stm->context->mainloop);
    if (iVar1 == 0) {
      (*cubeb_pa_threaded_mainloop_lock)(stm->context->mainloop);
    }
    iVar2 = (*cubeb_pa_stream_get_time)(stm->output_stream,&r_usec);
    if (iVar1 == 0) {
      (*cubeb_pa_threaded_mainloop_unlock)(stm->context->mainloop);
    }
    if (iVar2 == 0) {
      sVar3 = (*cubeb_pa_usec_to_bytes)(r_usec,&stm->output_sample_spec);
      sVar4 = (*cubeb_pa_frame_size)(&stm->output_sample_spec);
      iVar5 = 0;
      *position = sVar3 / sVar4;
    }
  }
  return iVar5;
}

Assistant:

static int
pulse_stream_get_position(cubeb_stream * stm, uint64_t * position)
{
  int r, in_thread;
  pa_usec_t r_usec;
  uint64_t bytes;

  if (!stm || !stm->output_stream) {
    return CUBEB_ERROR;
  }

  in_thread = WRAP(pa_threaded_mainloop_in_thread)(stm->context->mainloop);

  if (!in_thread) {
    WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  }
  r = WRAP(pa_stream_get_time)(stm->output_stream, &r_usec);
  if (!in_thread) {
    WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);
  }

  if (r != 0) {
    return CUBEB_ERROR;
  }

  bytes = WRAP(pa_usec_to_bytes)(r_usec, &stm->output_sample_spec);
  *position = bytes / WRAP(pa_frame_size)(&stm->output_sample_spec);

  return CUBEB_OK;
}